

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void TestGrammaAnalysis(char *test_file_name)

{
  SymbolQueue *pSVar1;
  ostream *poVar2;
  Symbol symbol;
  LexicalAnalysis lexical_analysis;
  Program program;
  
  LexicalAnalysis::LexicalAnalysis(&lexical_analysis,test_file_name);
  if (lexical_analysis.fp_in == (FILE *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"bad file");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    symbol.m_value.string_value._M_dataplus._M_p = (pointer)&symbol.m_value.string_value.field_2;
    symbol.m_value.string_value._M_string_length = 0;
    symbol.m_value.string_value.field_2._M_local_buf[0] = '\0';
    handle_symbol_queue = (SymbolQueue *)operator_new(0x20);
    (handle_symbol_queue->m_symbol_queue).super__Vector_base<Symbol,_std::allocator<Symbol>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (handle_symbol_queue->m_symbol_queue).super__Vector_base<Symbol,_std::allocator<Symbol>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    handle_symbol_queue->m_current_locate = 0;
    handle_symbol_queue->m_cache_locate = 0;
    (handle_symbol_queue->m_symbol_queue).super__Vector_base<Symbol,_std::allocator<Symbol>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    do {
      LexicalAnalysis::GetSym(&lexical_analysis,&symbol);
      std::vector<Symbol,_std::allocator<Symbol>_>::push_back
                (&handle_symbol_queue->m_symbol_queue,&symbol);
    } while (symbol.m_name != EOF_SYM);
    poVar2 = std::operator<<((ostream *)&std::cout,"push over");
    std::endl<char,std::char_traits<char>>(poVar2);
    Program::Program(&program);
    Program::Parse(&program);
    pSVar1 = handle_symbol_queue;
    if (handle_symbol_queue != (SymbolQueue *)0x0) {
      std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&handle_symbol_queue->m_symbol_queue);
    }
    operator_delete(pSVar1);
    Program::~Program(&program);
    std::__cxx11::string::~string((string *)&symbol.m_value.string_value);
  }
  LexicalAnalysis::~LexicalAnalysis(&lexical_analysis);
  return;
}

Assistant:

void TestGrammaAnalysis(const char* test_file_name) {
    int ret = COMPILE_OK;
    LexicalAnalysis lexical_analysis(test_file_name);
    if (!lexical_analysis.CheckFile()) {
        std::cerr << "bad file" << endl;
        return;
    }
    Symbol symbol;
    handle_symbol_queue = new SymbolQueue;
    while (true) {
        ret = lexical_analysis.GetSym(symbol);
        handle_symbol_queue->PushSymbol(symbol);
        SymbolName name = symbol.GetName();
        if (name == EOF_SYM)
            break;
    }
    cout << "push over" << endl;
    Program program;
    program.Parse();
    delete(handle_symbol_queue);
}